

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void trimFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3_value *pVal;
  void *pvVar2;
  int n;
  int iVar3;
  uint uVar4;
  uchar *z;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  uchar **p;
  ulong __n;
  ulong uVar8;
  
  pVal = *argv;
  uVar4._0_2_ = pVal->flags;
  uVar4._2_1_ = pVal->enc;
  uVar4._3_1_ = pVal->eSubtype;
  if (((0xaaaaaaaaU >> (uVar4 & 0x1f) & 1) != 0) ||
     (z = sqlite3_value_text(pVal), z == (uchar *)0x0)) {
    return;
  }
  n = sqlite3_value_bytes(*argv);
  if (argc == 1) {
    puVar7 = "\x01";
    p = trimFunc::azOne;
    uVar6 = 1;
  }
  else {
    puVar5 = sqlite3_value_text(argv[1]);
    if (puVar5 == (uchar *)0x0) {
      return;
    }
    uVar4 = 0;
    for (puVar7 = puVar5; *puVar7 != '\0'; puVar7 = puVar7 + 1) {
      uVar4 = uVar4 + 1;
    }
    if (uVar4 == 0) goto LAB_001831c8;
    p = (uchar **)contextMalloc(context,(ulong)uVar4 * 9);
    if (p == (uchar **)0x0) {
      return;
    }
    puVar7 = (uchar *)(p + uVar4);
    uVar6 = 0;
    while (*puVar5 != '\0') {
      p[uVar6] = puVar5;
      *(char *)((long)puVar7 + uVar6) = (char)(puVar5 + 1) - (char)puVar5;
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 1;
    }
    if (uVar6 == 0) goto LAB_001831c8;
  }
  pvVar2 = context->pFunc->pUserData;
  uVar6 = uVar6 & 0xffffffff;
  if ((0 < n & (byte)pvVar2) == 1) {
    do {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        __n = (ulong)*(byte *)((long)puVar7 + uVar8);
        if (((int)(uint)*(byte *)((long)puVar7 + uVar8) <= n) &&
           (iVar3 = bcmp(z,p[uVar8],__n), iVar3 == 0)) goto LAB_00183132;
      }
      __n = 0;
LAB_00183132:
      n = n - (int)__n;
      z = z + __n;
    } while ((uVar8 < uVar6) && (0 < n));
  }
  if (((ulong)pvVar2 & 2) != 0) {
    do {
      if (n < 1) break;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        bVar1 = *(byte *)((long)puVar7 + uVar8);
        uVar4 = (uint)bVar1;
        if (((int)(uint)bVar1 <= n) &&
           (iVar3 = bcmp(z + ((long)n - (ulong)bVar1),p[uVar8],(ulong)bVar1), iVar3 == 0))
        goto LAB_001831a4;
      }
      uVar4 = 0;
LAB_001831a4:
      n = n - uVar4;
    } while (uVar8 < uVar6);
  }
  if (argc != 1) {
    sqlite3_free(p);
  }
LAB_001831c8:
  sqlite3_result_text(context,(char *)z,n,(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void trimFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zIn;         /* Input string */
  const unsigned char *zCharSet;    /* Set of characters to trim */
  int nIn;                          /* Number of bytes in input */
  int flags;                        /* 1: trimleft  2: trimright  3: trim */
  int i;                            /* Loop counter */
  unsigned char *aLen = 0;          /* Length of each character in zCharSet */
  unsigned char **azChar = 0;       /* Individual characters in zCharSet */
  int nChar;                        /* Number of characters in zCharSet */

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    return;
  }
  zIn = sqlite3_value_text(argv[0]);
  if( zIn==0 ) return;
  nIn = sqlite3_value_bytes(argv[0]);
  assert( zIn==sqlite3_value_text(argv[0]) );
  if( argc==1 ){
    static const unsigned char lenOne[] = { 1 };
    static unsigned char * const azOne[] = { (u8*)" " };
    nChar = 1;
    aLen = (u8*)lenOne;
    azChar = (unsigned char **)azOne;
    zCharSet = 0;
  }else if( (zCharSet = sqlite3_value_text(argv[1]))==0 ){
    return;
  }else{
    const unsigned char *z;
    for(z=zCharSet, nChar=0; *z; nChar++){
      SQLITE_SKIP_UTF8(z);
    }
    if( nChar>0 ){
      azChar = contextMalloc(context, ((i64)nChar)*(sizeof(char*)+1));
      if( azChar==0 ){
        return;
      }
      aLen = (unsigned char*)&azChar[nChar];
      for(z=zCharSet, nChar=0; *z; nChar++){
        azChar[nChar] = (unsigned char *)z;
        SQLITE_SKIP_UTF8(z);
        aLen[nChar] = (u8)(z - azChar[nChar]);
      }
    }
  }
  if( nChar>0 ){
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(context));
    if( flags & 1 ){
      while( nIn>0 ){
        int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(zIn, azChar[i], len)==0 ) break;
        }
        if( i>=nChar ) break;
        zIn += len;
        nIn -= len;
      }
    }
    if( flags & 2 ){
      while( nIn>0 ){
        int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(&zIn[nIn-len],azChar[i],len)==0 ) break;
        }
        if( i>=nChar ) break;
        nIn -= len;
      }
    }
    if( zCharSet ){
      sqlite3_free(azChar);
    }
  }
  sqlite3_result_text(context, (char*)zIn, nIn, SQLITE_TRANSIENT);
}